

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O2

ktx_error_code_e anon_unknown.dwarf_5278::StreambufStream::getsize(ktxStream *str,ktx_size_t *size)

{
  FILE *pFVar1;
  ktx_error_code_e kVar2;
  long lVar3;
  ktx_size_t kVar4;
  long lVar5;
  ostream *poVar6;
  
  pFVar1 = (str->data).file;
  lVar3 = (**(code **)(**(long **)(pFVar1 + 8) + 0x20))
                    (*(long **)(pFVar1 + 8),0,1,*(undefined4 *)(pFVar1 + 0x10));
  kVar4 = (**(code **)(**(long **)(pFVar1 + 8) + 0x20))(*(long **)(pFVar1 + 8),0,2,0x18);
  *size = kVar4;
  lVar5 = (**(code **)(**(long **)(pFVar1 + 8) + 0x20))
                    (*(long **)(pFVar1 + 8),lVar3,0,*(undefined4 *)(pFVar1 + 0x10));
  poVar6 = std::operator<<((ostream *)&std::cerr,"\t  size: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,'B');
  std::endl<char,std::char_traits<char>>(poVar6);
  kVar2 = KTX_FILE_SEEK_ERROR;
  if (lVar3 == lVar5) {
    kVar2 = KTX_SUCCESS;
  }
  return kVar2;
}

Assistant:

static KTX_error_code getsize(ktxStream* str, ktx_size_t* size)
    {
        auto self = parent(str);
        const std::streampos oldpos = self->_streambuf->pubseekoff(0, std::ios::cur, self->_seek_mode);
        *size = ktx_size_t(self->_streambuf->pubseekoff(0, std::ios::end));
        const std::streampos newpos = self->_streambuf->pubseekoff(oldpos, std::ios::beg, self->_seek_mode);
        std::cerr << "\t  size: " << *size << 'B' << std::endl;
        return (oldpos == newpos) ? KTX_SUCCESS : KTX_FILE_SEEK_ERROR;
    }